

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmenu.cpp
# Opt level: O0

void __thiscall QMenu::setTearOffEnabled(QMenu *this,bool b)

{
  long lVar1;
  byte bVar2;
  bool bVar3;
  QMenuPrivate *pQVar4;
  byte in_SIL;
  QMenu *in_RDI;
  long in_FS_OFFSET;
  QSize *unaff_retaddr;
  QWidget *in_stack_00000008;
  QMenuPrivate *d;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  bVar2 = in_SIL & 1;
  pQVar4 = d_func((QMenu *)0x646c63);
  if (((byte)((ushort)*(undefined2 *)&pQVar4->field_0x420 >> 9) & 1) != bVar2) {
    if (bVar2 == 0) {
      hideTearOffMenu(in_RDI);
    }
    *(ushort *)&pQVar4->field_0x420 = *(ushort *)&pQVar4->field_0x420 & 0xfdff | (ushort)bVar2 << 9;
    *(ushort *)&pQVar4->field_0x420 = *(ushort *)&pQVar4->field_0x420 & 0xfffe | 1;
    bVar3 = QWidget::isVisible((QWidget *)0x646cf6);
    if (bVar3) {
      (**(code **)(*(long *)&in_RDI->super_QWidget + 0x70))();
      QWidget::resize(in_stack_00000008,unaff_retaddr);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QMenu::setTearOffEnabled(bool b)
{
    Q_D(QMenu);
    if (d->tearoff == b)
        return;
    if (!b)
        hideTearOffMenu();
    d->tearoff = b;

    d->itemsDirty = true;
    if (isVisible())
        resize(sizeHint());
}